

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::file_handle::close(file_handle *this,int __fd)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  error_code eVar5;
  error_code err;
  error_or<int> file_or_error;
  error_or<int> eStack_58;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  error_code *peVar4;
  
  this->is_writable_ = false;
  close_noex(&eStack_58,this->file_);
  if (eStack_58.has_error_ != true) {
    piVar3 = error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&eStack_58);
    this->file_ = *piVar3;
    if (eStack_58.has_error_ == false) {
      piVar3 = error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&eStack_58);
      iVar2 = (int)piVar3;
    }
    else {
      peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&eStack_58)
      ;
      iVar2 = (int)peVar4;
    }
    return iVar2;
  }
  eVar5 = error_or<int>::get_error(&eStack_58);
  local_40[0] = local_30;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->path_)._M_string_length);
  err._M_cat = (error_category *)local_40;
  err._0_8_ = eVar5._M_cat;
  (anonymous_namespace)::raise_file_error<std::error_code,char_const*,std::__cxx11::string>
            ((_anonymous_namespace_ *)(ulong)(uint)eVar5._M_value,err,in_RCX,in_R8);
}

Assistant:

void file_handle::close () {
            is_writable_ = false;
            auto file_or_error = file_handle::close_noex (file_);
            if (!file_or_error) {
                raise_file_error (file_or_error.get_error (), "Unable to close", path_);
            }
            file_ = *file_or_error;
        }